

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O3

void __thiscall
QAbstractFileEngineIterator::~QAbstractFileEngineIterator(QAbstractFileEngineIterator *this)

{
  Data *pDVar1;
  
  this->_vptr_QAbstractFileEngineIterator = (_func_int **)&PTR__QAbstractFileEngineIterator_0017f9f8
  ;
  pDVar1 = (this->m_path).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_path).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_nameFilters).d);
  QFileInfo::~QFileInfo(&this->m_fileInfo);
  return;
}

Assistant:

QAbstractFileEngineIterator::~QAbstractFileEngineIterator()
{
}